

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

void __thiscall
dxil_spv::Converter::Impl::decorate_relaxed_precision
          (Impl *this,Type *type,Id id,bool known_integer_sign)

{
  bool bVar1;
  Builder *this_00;
  
  bVar1 = type_can_relax_precision(this,type,known_integer_sign);
  if (bVar1) {
    this_00 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(this_00,id,DecorationRelaxedPrecision,-1);
    return;
  }
  return;
}

Assistant:

void Converter::Impl::decorate_relaxed_precision(const llvm::Type *type, spv::Id id, bool known_integer_sign)
{
	// Ignore RelaxedPrecision for integers since they are untyped in LLVM for the most part.
	// For texture loading operations and similar, we load in the appropriate sign, so it's safe to use RelaxedPrecision,
	// since RelaxedPrecision may sign-extend based on the OpTypeInt's signage.
	// DXIL is kinda broken in this regard since min16int and min16uint lower to the same i16 type ... :(
	if (type_can_relax_precision(type, known_integer_sign))
		builder().addDecoration(id, spv::DecorationRelaxedPrecision);
}